

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void add_bb_insn_dead_vars(gen_ctx_t gen_ctx)

{
  ulong *puVar1;
  in_edge_t peVar2;
  bb_t pbVar3;
  VARR_MIR_reg_t *pVVar4;
  byte bVar5;
  bool bVar6;
  uint uVar7;
  bb_t_conflict pbVar8;
  void *pvVar9;
  bb_t pbVar10;
  bb_t_conflict pbVar11;
  bitmap_t pVVar12;
  bitmap_el_t *pbVar13;
  bb_insn_t_conflict elem;
  ulong uVar14;
  ulong uVar15;
  bb_t *ppbVar16;
  DLIST_LINK_in_edge_t *pDVar17;
  uint unaff_EBP;
  bb_t_conflict in_RSI;
  DLIST_dead_var_t *pDVar18;
  gen_ctx_t gen_ctx_00;
  size_t nop;
  ulong nop_00;
  bb_t_conflict bb_insn;
  DLIST_in_edge_t *pDVar19;
  MIR_reg_t *reg_map;
  undefined1 auVar20 [32];
  int out_p;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_reg_t early_clobbered_hard_reg1;
  int local_8c;
  bb_t_conflict local_88;
  bb_t_conflict local_80;
  bb_t_conflict local_78;
  DLIST_in_edge_t *local_70;
  uint local_68;
  uint local_64;
  DLIST_LINK_in_edge_t *local_60;
  bb_t_conflict local_58;
  bb_t *local_50;
  bb_t local_48;
  DLIST_dead_var_t *local_40;
  DLIST_LINK_bb_t *local_38;
  
  if (gen_ctx->optimize_level == 0) {
LAB_0015ee99:
    __assert_fail("gen_ctx->optimize_level > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1802,"void add_bb_insn_dead_vars(gen_ctx_t)");
  }
  pbVar8 = (bb_t_conflict)malloc(0x18);
  pbVar8->index = 0;
  pbVar8->pre = 4;
  pvVar9 = malloc(0x20);
  pbVar8->rpost = (size_t)pvVar9;
  pbVar11 = (gen_ctx->curr_cfg->bbs).head;
  if (pbVar11 != (bb_t_conflict)0x0) {
    local_40 = &gen_ctx->free_dead_vars;
    local_50 = (bb_t *)&(gen_ctx->free_dead_vars).tail;
    local_78 = pbVar8;
    do {
      in_RSI = (bb_t_conflict)pbVar11->out;
      bitmap_copy((bitmap_t)pbVar8,(const_bitmap_t)in_RSI);
      bb_insn = (bb_t_conflict)(pbVar11->bb_insns).tail;
      local_58 = pbVar11;
      while (bb_insn != (bb_t_conflict)0x0) {
        local_48 = (bb_insn->bb_link).prev;
        in_RSI = bb_insn;
        clear_bb_insn_dead_vars(gen_ctx,(bb_insn_t_conflict)bb_insn);
        local_88 = (bb_t_conflict)bb_insn->index;
        uVar15 = (ulong)*(uint *)((long)&local_88->bfs + 4);
        local_70 = &local_88->in_edges;
        nop = 0;
        local_80 = bb_insn;
LAB_0015ea9d:
        bVar6 = true;
        if (nop < uVar15) {
          pDVar19 = local_70 + nop * 3;
          do {
            in_RSI = local_88;
            MIR_insn_op_mode(gen_ctx->ctx,(MIR_insn_t_conflict)local_88,nop,&local_8c);
            pbVar8 = local_78;
            if ((local_8c != 0) && (*(char *)&((DLIST_LINK_bb_t *)(pDVar19 + -1))->next != '\v')) {
              if (*(char *)&((DLIST_LINK_bb_t *)(pDVar19 + -1))->next != '\x02') {
                __assert_fail("op_ref->mode == MIR_OP_VAR",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x4ff,
                              "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                             );
              }
              unaff_EBP = *(uint *)&pDVar19->head;
              nop = nop + 1;
              bVar6 = false;
              goto LAB_0015eb00;
            }
            nop = nop + 1;
            pDVar19 = pDVar19 + 3;
          } while (uVar15 != nop);
          bVar6 = true;
        }
LAB_0015eb00:
        if (!bVar6) {
          in_RSI = (bb_t_conflict)(ulong)unaff_EBP;
          uVar7 = var_to_scan_var(gen_ctx,unaff_EBP);
          if ((-1 < (int)uVar7) && ((ulong)uVar7 < pbVar8->index << 6)) {
            bVar5 = (byte)uVar7 & 0x3f;
            in_RSI = (bb_t_conflict)(-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
            puVar1 = (ulong *)(pbVar8->rpost + (ulong)(uVar7 >> 6) * 8);
            *puVar1 = *puVar1 & (ulong)in_RSI;
          }
          goto LAB_0015ea9d;
        }
        if ((gen_ctx->lr_ctx->scan_vars_num == 0) && (0xfffffffc < (int)local_88->bfs - 0xaaU)) {
          bitmap_and_compl((bitmap_t)pbVar8,(bitmap_t)pbVar8,gen_ctx->call_used_hard_regs[0x12]);
          in_RSI = pbVar8;
        }
        local_70 = (DLIST_in_edge_t *)(ulong)*(uint *)((long)&local_88->bfs + 4);
        local_38 = &local_88->bb_link;
        local_60 = (DLIST_LINK_in_edge_t *)&(local_80->in_edges).tail;
        nop_00 = 0;
        uVar15 = 0;
LAB_0015eb9d:
        bVar6 = true;
        uVar14 = uVar15;
        if (nop_00 < local_70) {
          do {
            in_RSI = local_88;
            MIR_insn_op_mode(gen_ctx->ctx,(MIR_insn_t_conflict)local_88,nop_00,&local_8c);
            if ((local_8c == 0) || (uVar15 = uVar14, *(char *)&local_38[nop_00 * 3].next == '\v')) {
              if (uVar14 < 2) {
                while (*(char *)&local_38[nop_00 * 3].next == '\v') {
                  in_RSI = (bb_t_conflict)(ulong)(uVar14 != 0);
                  unaff_EBP = *(uint *)((long)&local_38[nop_00 * 3 + 2].prev + (long)in_RSI * 4);
                  if (unaff_EBP != 0xffffffff) goto LAB_0015ec2f;
                  if (uVar14 != 0) goto LAB_0015ec1d;
                  uVar14 = 1;
                }
                if (uVar14 != 1) {
                  uVar15 = 0;
                  if (*(char *)&local_38[nop_00 * 3].next != '\x02') goto LAB_0015ec20;
                  unaff_EBP = *(uint *)&local_38[nop_00 * 3 + 1].prev;
LAB_0015ec2f:
                  uVar15 = uVar14 + 1;
                  bVar6 = false;
                  break;
                }
              }
LAB_0015ec1d:
              uVar15 = 0;
            }
LAB_0015ec20:
            nop_00 = nop_00 + 1;
            uVar14 = uVar15;
          } while ((DLIST_in_edge_t *)nop_00 != local_70);
        }
        pbVar8 = local_78;
        if (!bVar6) {
          in_RSI = (bb_t_conflict)(ulong)unaff_EBP;
          uVar7 = var_to_scan_var(gen_ctx,unaff_EBP);
          pbVar11 = local_78;
          if (-1 < (int)uVar7) {
            bitmap_expand((bitmap_t)local_78,(ulong)uVar7 + 1);
            uVar14 = *(ulong *)(pbVar11->rpost + (ulong)(uVar7 >> 6) * 8);
            in_RSI = (bb_t_conflict)(uVar14 | 1L << ((ulong)uVar7 & 0x3f));
            *(bb_t_conflict *)(pbVar11->rpost + (ulong)(uVar7 >> 6) * 8) = in_RSI;
            if ((uVar14 >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
              for (peVar2 = local_60->prev; peVar2 != (in_edge_t)0x0;
                  peVar2 = (peVar2->in_link).prev) {
                if (*(uint *)&peVar2->src == unaff_EBP) goto LAB_0015eb9d;
              }
              pbVar10 = (bb_t)local_40->head;
              if (pbVar10 != (bb_t)0x0) {
                pbVar3 = (bb_t)pbVar10->pre;
                pDVar18 = (DLIST_dead_var_t *)&pbVar3->rpost;
                if (pbVar3 == (bb_t)0x0) {
                  pDVar18 = local_40;
                }
                pDVar18->head = (dead_var_t_conflict)((DLIST_LINK_in_edge_t *)&pbVar10->rpost)->prev
                ;
                peVar2 = ((DLIST_LINK_in_edge_t *)&pbVar10->rpost)->prev;
                if (peVar2 != (in_edge_t)0x0) {
                  ppbVar16 = &peVar2->dst;
LAB_0015ed0b:
                  in_RSI = (bb_t_conflict)&pbVar10->pre;
                  *ppbVar16 = pbVar3;
                  *(size_t *)in_RSI = 0;
                  pbVar10->rpost = 0;
                  goto LAB_0015ed1a;
                }
                ppbVar16 = local_50;
                if (*local_50 == pbVar10) goto LAB_0015ed0b;
LAB_0015ee94:
                add_bb_insn_dead_vars_cold_1();
                goto LAB_0015ee99;
              }
              pbVar10 = (bb_t)malloc(0x18);
              if (pbVar10 == (bb_t)0x0) goto LAB_0015ee80;
LAB_0015ed1a:
              *(uint *)&((in_edge_t)pbVar10)->src = unaff_EBP;
              pbVar3 = (bb_t)(local_80->out_edges).head;
              if (pbVar3 == (bb_t)0x0) {
                pDVar17 = local_60;
                if (local_60->prev != (in_edge_t)0x0) {
                  add_bb_insn_dead_vars_cold_3();
                  goto LAB_0015ee94;
                }
              }
              else {
                if (((DLIST_LINK_in_edge_t *)&pbVar3->rpost)->prev != (in_edge_t)0x0) {
                  add_bb_insn_dead_vars_cold_2();
LAB_0015ee80:
                  util_error(gen_ctx,"no memory");
                }
                pDVar17 = (DLIST_LINK_in_edge_t *)&pbVar3->rpost;
              }
              pDVar17->prev = (in_edge_t)pbVar10;
              (((in_edge_t)pbVar10)->in_link).prev = (in_edge_t)0x0;
              ((in_edge_t)pbVar10)->dst = pbVar3;
              (local_80->out_edges).head = (out_edge_t)pbVar10;
            }
          }
          goto LAB_0015eb9d;
        }
        bb_insn = local_48;
        if (gen_ctx->lr_ctx->scan_vars_num == 0) {
          in_RSI = (bb_t_conflict)&stack0xffffffffffffff9c;
          target_get_early_clobbered_hard_regs((MIR_insn_t)local_88,(MIR_reg_t *)in_RSI,&local_68);
          if (((ulong)local_64 != 0xffffffff) && ((ulong)local_64 < pbVar8->index << 6)) {
            bVar5 = (byte)local_64 & 0x3f;
            in_RSI = (bb_t_conflict)(-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
            puVar1 = (ulong *)(pbVar8->rpost + (ulong)(local_64 >> 6) * 8);
            *puVar1 = *puVar1 & (ulong)in_RSI;
          }
          if (((ulong)local_68 != 0xffffffff) && ((ulong)local_68 < pbVar8->index << 6)) {
            bVar5 = (byte)local_68 & 0x3f;
            in_RSI = (bb_t_conflict)(-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
            puVar1 = (ulong *)(pbVar8->rpost + (ulong)(local_68 >> 6) * 8);
            *puVar1 = *puVar1 & (ulong)in_RSI;
          }
          bb_insn = local_48;
          if (0xfffffffc < (int)local_88->bfs - 0xaaU) {
            in_RSI = pbVar8;
            bitmap_ior((bitmap_t)pbVar8,(bitmap_t)pbVar8,(bitmap_t)(local_80->out_edges).tail);
            bb_insn = local_48;
          }
        }
      }
      pbVar11 = (local_58->bb_link).next;
    } while (pbVar11 != (bb_t)0x0);
  }
  gen_ctx_00 = (gen_ctx_t)pbVar8->rpost;
  if (gen_ctx_00 != (gen_ctx_t)0x0) {
    free(gen_ctx_00);
    free(pbVar8);
    return;
  }
  add_bb_insn_dead_vars_cold_4();
  if (gen_ctx_00->lr_ctx->scan_vars_num == 0) {
    reg_map = (MIR_reg_t *)0x0;
  }
  else {
    pVVar4 = gen_ctx_00->lr_ctx->scan_var_to_var_map;
    if (pVVar4 == (VARR_MIR_reg_t *)0x0) {
      output_bb_live_info_cold_1();
      pbVar11 = (bb_t_conflict)malloc(0xa8);
      if (pbVar11 != (bb_t_conflict)0x0) {
        pbVar11->loop_node = (loop_node_t_conflict)0x0;
        pVVar12 = (bitmap_t)malloc(0x18);
        pbVar11->pre = 0;
        pbVar11->rpost = 0;
        pbVar11->bfs = 0;
        auVar20 = ZEXT432(0) << 0x40;
        (pbVar11->in_edges).head = (in_edge_t_conflict)SUB168(auVar20._0_16_,0);
        (pbVar11->in_edges).tail = (in_edge_t_conflict)SUB168(auVar20._0_16_,8);
        (pbVar11->out_edges).head = (out_edge_t)SUB168(auVar20._16_16_,0);
        (pbVar11->out_edges).tail = (out_edge_t)SUB168(auVar20._16_16_,8);
        *(undefined1 (*) [32])((long)&(pbVar11->out_edges).head + 3) = auVar20;
        pVVar12->els_num = 0;
        pVVar12->size = 4;
        pbVar13 = (bitmap_el_t *)malloc(0x20);
        pVVar12->varr = pbVar13;
        pbVar11->in = pVVar12;
        pVVar12 = (bitmap_t)malloc(0x18);
        pVVar12->els_num = 0;
        pVVar12->size = 4;
        pbVar13 = (bitmap_el_t *)malloc(0x20);
        pVVar12->varr = pbVar13;
        pbVar11->out = pVVar12;
        pVVar12 = (bitmap_t)malloc(0x18);
        pVVar12->els_num = 0;
        pVVar12->size = 4;
        pbVar13 = (bitmap_el_t *)malloc(0x20);
        pVVar12->varr = pbVar13;
        pbVar11->gen = pVVar12;
        pVVar12 = (bitmap_t)malloc(0x18);
        pVVar12->els_num = 0;
        pVVar12->size = 4;
        pbVar13 = (bitmap_el_t *)malloc(0x20);
        pVVar12->varr = pbVar13;
        pbVar11->kill = pVVar12;
        pVVar12 = (bitmap_t)malloc(0x18);
        pVVar12->els_num = 0;
        pVVar12->size = 4;
        pbVar13 = (bitmap_el_t *)malloc(0x20);
        pVVar12->varr = pbVar13;
        pbVar11->dom_in = pVVar12;
        pVVar12 = (bitmap_t)malloc(0x18);
        pVVar12->els_num = 0;
        pVVar12->size = 4;
        pbVar13 = (bitmap_el_t *)malloc(0x20);
        pVVar12->varr = pbVar13;
        pbVar11->dom_out = pVVar12;
        pbVar11->max_int_pressure = 0;
        pbVar11->max_fp_pressure = 0;
        if (in_RSI != (bb_t_conflict)0x0) {
          if (gen_ctx_00->optimize_level == 0) {
            setup_insn_data(gen_ctx_00,(MIR_insn_t)in_RSI,pbVar11);
          }
          else {
            elem = create_bb_insn(gen_ctx_00,(MIR_insn_t)in_RSI,pbVar11);
            DLIST_bb_insn_t_append(&pbVar11->bb_insns,elem);
          }
        }
        return;
      }
      util_error(gen_ctx_00,"no memory");
    }
    reg_map = pVVar4->varr;
  }
  output_bb_border_live_info(gen_ctx_00,in_RSI);
  output_bitmap(gen_ctx_00,"  live_gen:",in_RSI->gen,1,reg_map);
  output_bitmap(gen_ctx_00,"  live_kill:",in_RSI->kill,1,reg_map);
  return;
}

Assistant:

static void add_bb_insn_dead_vars (gen_ctx_t gen_ctx) {
  MIR_insn_t insn;
  bb_insn_t bb_insn, prev_bb_insn;
  MIR_reg_t var, early_clobbered_hard_reg1, early_clobbered_hard_reg2;
  int scan_var, op_num;
  bitmap_t live;
  insn_var_iterator_t insn_var_iter;

  /* we need all var analysis and bb insns to keep dead var info */
  gen_assert (optimize_level > 0);
  live = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    bitmap_copy (live, bb->live_out);
    for (bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns); bb_insn != NULL; bb_insn = prev_bb_insn) {
      prev_bb_insn = DLIST_PREV (bb_insn_t, bb_insn);
      clear_bb_insn_dead_vars (gen_ctx, bb_insn);
      insn = bb_insn->insn;
      FOREACH_OUT_INSN_VAR (gen_ctx, insn_var_iter, insn, var, op_num) {
        if ((scan_var = var_to_scan_var (gen_ctx, var)) < 0) continue;
        bitmap_clear_bit_p (live, scan_var);
      }
      if (scan_vars_num == 0 && MIR_call_code_p (insn->code))
        bitmap_and_compl (live, live, call_used_hard_regs[MIR_T_UNDEF]);
      FOREACH_IN_INSN_VAR (gen_ctx, insn_var_iter, insn, var, op_num) {
        if ((scan_var = var_to_scan_var (gen_ctx, var)) < 0) continue;
        if (bitmap_set_bit_p (live, scan_var)) add_bb_insn_dead_var (gen_ctx, bb_insn, var);
      }
      if (scan_vars_num != 0) continue;
      target_get_early_clobbered_hard_regs (insn, &early_clobbered_hard_reg1,
                                            &early_clobbered_hard_reg2);
      if (early_clobbered_hard_reg1 != MIR_NON_VAR)
        bitmap_clear_bit_p (live, early_clobbered_hard_reg1);
      if (early_clobbered_hard_reg2 != MIR_NON_VAR)
        bitmap_clear_bit_p (live, early_clobbered_hard_reg2);
      if (MIR_call_code_p (insn->code)) bitmap_ior (live, live, bb_insn->call_hard_reg_args);
    }
  }
  bitmap_destroy (live);
}